

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O2

void __thiscall google::protobuf::compiler::python::Generator::PrintTopLevelEnums(Generator *this)

{
  undefined4 uVar1;
  Printer *pPVar2;
  long lVar3;
  AlphaNum *a;
  int j;
  long lVar4;
  long lVar5;
  EnumDescriptor *enum_descriptor;
  ulong uVar6;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  top_level_enum_values;
  string local_a0;
  AlphaNum local_80;
  string local_50;
  
  top_level_enum_values.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  top_level_enum_values.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  top_level_enum_values.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  for (lVar3 = 0; lVar3 < *(int *)(this->file_ + 0x30); lVar3 = lVar3 + 1) {
    enum_descriptor = (EnumDescriptor *)(lVar3 * 0x50 + *(long *)(this->file_ + 0x70));
    PrintEnum(this,enum_descriptor);
    pPVar2 = this->printer_;
    anon_unknown_0::ResolveKeyword((string *)&local_80,*(string **)enum_descriptor);
    ModuleLevelDescriptorName<google::protobuf::EnumDescriptor>(&local_a0,this,enum_descriptor);
    io::Printer::Print<char[5],std::__cxx11::string,char[16],std::__cxx11::string>
              (pPVar2,"$name$ = enum_type_wrapper.EnumTypeWrapper($descriptor_name$)",
               (char (*) [5])0x38d8c6,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_80,
               (char (*) [16])0x39cf67,&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_80);
    io::Printer::Print<>(this->printer_,"\n");
    lVar5 = 0x10;
    for (lVar4 = 0; lVar4 < *(int *)(enum_descriptor + 0x2c); lVar4 = lVar4 + 1) {
      uVar1 = *(undefined4 *)(*(long *)(enum_descriptor + 0x30) + lVar5);
      std::__cxx11::string::string
                ((string *)&local_80,*(string **)(*(long *)(enum_descriptor + 0x30) + -0x10 + lVar5)
                );
      local_80.digits._16_4_ = uVar1;
      std::
      vector<std::pair<std::__cxx11::string,int>,std::allocator<std::pair<std::__cxx11::string,int>>>
      ::emplace_back<std::pair<std::__cxx11::string,int>>
                ((vector<std::pair<std::__cxx11::string,int>,std::allocator<std::pair<std::__cxx11::string,int>>>
                  *)&top_level_enum_values,
                 (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                  *)&local_80);
      std::__cxx11::string::~string((string *)&local_80);
      lVar5 = lVar5 + 0x28;
    }
  }
  lVar3 = 0;
  uVar6 = 0;
  while( true ) {
    pPVar2 = this->printer_;
    if ((ulong)(((long)top_level_enum_values.
                       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                (long)top_level_enum_values.
                      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_start) / 0x28) <= uVar6) break;
    anon_unknown_0::ResolveKeyword
              (&local_a0,
               (string *)
               ((long)&((top_level_enum_values.
                         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->first)._M_dataplus._M_p + lVar3
               ));
    strings::AlphaNum::AlphaNum
              (&local_80,
               *(int *)((long)&(top_level_enum_values.
                                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->second + lVar3));
    StrCat_abi_cxx11_(&local_50,(protobuf *)&local_80,a);
    io::Printer::Print<char[5],std::__cxx11::string,char[6],std::__cxx11::string>
              (pPVar2,"$name$ = $value$\n",(char (*) [5])0x38d8c6,&local_a0,(char (*) [6])0x3ddc42,
               &local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_a0);
    uVar6 = uVar6 + 1;
    lVar3 = lVar3 + 0x28;
  }
  io::Printer::Print<>(pPVar2,"\n");
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~vector(&top_level_enum_values);
  return;
}

Assistant:

void Generator::PrintTopLevelEnums() const {
  std::vector<std::pair<std::string, int> > top_level_enum_values;
  for (int i = 0; i < file_->enum_type_count(); ++i) {
    const EnumDescriptor& enum_descriptor = *file_->enum_type(i);
    PrintEnum(enum_descriptor);
    printer_->Print(
        "$name$ = "
        "enum_type_wrapper.EnumTypeWrapper($descriptor_name$)",
        "name", ResolveKeyword(enum_descriptor.name()), "descriptor_name",
        ModuleLevelDescriptorName(enum_descriptor));
    printer_->Print("\n");

    for (int j = 0; j < enum_descriptor.value_count(); ++j) {
      const EnumValueDescriptor& value_descriptor = *enum_descriptor.value(j);
      top_level_enum_values.push_back(
          std::make_pair(value_descriptor.name(), value_descriptor.number()));
    }
  }

  for (int i = 0; i < top_level_enum_values.size(); ++i) {
    printer_->Print("$name$ = $value$\n", "name",
                    ResolveKeyword(top_level_enum_values[i].first), "value",
                    StrCat(top_level_enum_values[i].second));
  }
  printer_->Print("\n");
}